

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O3

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<
          (iuStreamMessage *this,
          variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  anon_class_8_1_3fcf66a2 local_1a8;
  iu_ostream *local_1a0;
  undefined1 local_198 [128];
  ios_base local_118 [264];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_198);
  local_1a0 = (iu_ostream *)(local_198 + 0x10);
  local_1a8.os = &local_1a0;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/../internal/../iutest_printers.hpp:512:22)_&&,_const_std::variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [(value->
     super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ).super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_1a8,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(char *)local_1c8,
             local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }